

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gf.h
# Opt level: O0

uint gf_matr_det(uint **M,uint rows,uint cols)

{
  uint uVar1;
  uint b;
  uint second;
  uint first;
  uint cols_local;
  uint rows_local;
  uint **M_local;
  
  if ((rows != cols) && (rows != 2)) {
    fatal((uchar *)"gf_det",(uchar *)"only 2x2 matrix\n");
  }
  uVar1 = gf_mul(**M,M[1][1]);
  b = gf_mul(*M[1],(*M)[1]);
  uVar1 = gf_sum(uVar1,b);
  return uVar1;
}

Assistant:

uint32_t gf_matr_det(uint32_t **M, uint32_t rows, uint32_t cols)
{
    if (rows != cols && rows != 2)
        fatal("gf_det", "only 2x2 matrix\n");

    uint32_t first = gf_mul(M[0][0], M[1][1]);
    uint32_t second = gf_mul(M[1][0], M[0][1]);
    return gf_sum(first, second);
}